

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.hh
# Opt level: O3

void __thiscall kratos::Attribute::~Attribute(Attribute *this)

{
  ~Attribute(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

virtual ~Attribute() = default;